

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<JointPolicyPureVector>::shared_ptr<JointPolicyPureVector>
          (shared_ptr<JointPolicyPureVector> *this,JointPolicyPureVector *p)

{
  this->px = p;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::sp_pointer_construct<JointPolicyPureVector,JointPolicyPureVector>(this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }